

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinImporter::ReadBinaryTexture(AssbinImporter *this,IOStream *stream,aiTexture *tex)

{
  undefined1 auVar1 [16];
  uint uVar2;
  DeadlyImportError *this_00;
  ulong uVar3;
  aiTexel *paVar4;
  allocator<char> local_41;
  string local_40;
  aiTexture *local_20;
  aiTexture *tex_local;
  IOStream *stream_local;
  AssbinImporter *this_local;
  
  local_20 = tex;
  tex_local = (aiTexture *)stream;
  stream_local = (IOStream *)this;
  uVar2 = Read<unsigned_int>(stream);
  if (uVar2 == 0x1236) {
    Read<unsigned_int>((IOStream *)tex_local);
    uVar2 = Read<unsigned_int>((IOStream *)tex_local);
    local_20->mWidth = uVar2;
    uVar2 = Read<unsigned_int>((IOStream *)tex_local);
    local_20->mHeight = uVar2;
    (**(code **)(*(long *)tex_local + 0x10))(tex_local,local_20->achFormatHint,1,4);
    if ((this->shortened & 1U) == 0) {
      if (local_20->mHeight == 0) {
        auVar1 = ZEXT416(local_20->mWidth) * ZEXT816(4);
        uVar3 = auVar1._0_8_;
        if (auVar1._8_8_ != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        paVar4 = (aiTexel *)operator_new__(uVar3);
        local_20->pcData = paVar4;
        (**(code **)(*(long *)tex_local + 0x10))(tex_local,local_20->pcData,1,local_20->mWidth);
      }
      else {
        auVar1 = ZEXT416(local_20->mWidth * local_20->mHeight) * ZEXT816(4);
        uVar3 = auVar1._0_8_;
        if (auVar1._8_8_ != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        paVar4 = (aiTexel *)operator_new__(uVar3);
        local_20->pcData = paVar4;
        (**(code **)(*(long *)tex_local + 0x10))
                  (tex_local,local_20->pcData,1,local_20->mWidth * local_20->mHeight * 4);
      }
    }
    return;
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Magic chunk identifiers are wrong!",&local_41);
  DeadlyImportError::DeadlyImportError(this_00,&local_40);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void AssbinImporter::ReadBinaryTexture(IOStream * stream, aiTexture* tex) {
    if(Read<uint32_t>(stream) != ASSBIN_CHUNK_AITEXTURE)
        throw DeadlyImportError("Magic chunk identifiers are wrong!");
    /*uint32_t size =*/ Read<uint32_t>(stream);

    tex->mWidth = Read<unsigned int>(stream);
    tex->mHeight = Read<unsigned int>(stream);
    stream->Read( tex->achFormatHint, sizeof(char), 4 );

    if(!shortened) {
        if (!tex->mHeight) {
            tex->pcData = new aiTexel[ tex->mWidth ];
            stream->Read(tex->pcData,1,tex->mWidth);
        } else {
            tex->pcData = new aiTexel[ tex->mWidth*tex->mHeight ];
            stream->Read(tex->pcData,1,tex->mWidth*tex->mHeight*4);
        }
    }
}